

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivDeriveReprs(Gia_Man_t *p,Gia_Man_t *pNew,Gia_Man_t *pFinal)

{
  bool bVar1;
  int iVar2;
  uint Entry;
  int Num;
  int Id;
  Gia_Rpr_t *pGVar3;
  long lVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  int i;
  uint Id_00;
  ulong uVar7;
  uint v;
  int iVar8;
  
  iVar2 = pFinal->nObjs;
  pGVar3 = (Gia_Rpr_t *)calloc((long)iVar2,4);
  pFinal->pReprs = pGVar3;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    pFinal->pReprs[lVar4] = (Gia_Rpr_t)((uint)pFinal->pReprs[lVar4] | 0xfffffff);
    iVar2 = pFinal->nObjs;
  }
  for (lVar4 = 1; lVar4 < p->nObjs; lVar4 = lVar4 + 1) {
    if (((uint)p->pReprs[lVar4] & 0xfffffff) == 0) {
      pGVar5 = Gia_ManObj(p,(int)lVar4);
      if (pGVar5->Value != 0xffffffff) {
        iVar2 = Abc_Lit2Var(pGVar5->Value);
        pGVar5 = Gia_ManObj(pNew,iVar2);
        iVar2 = Abc_Lit2Var(pGVar5->Value);
        if (iVar2 != 0) {
          iVar2 = Abc_Lit2Var(pGVar5->Value);
          Gia_ObjSetRepr(pFinal,iVar2,0);
        }
      }
    }
  }
  p_00 = Vec_IntAlloc(100);
  uVar7 = 1;
  do {
    Id_00 = (uint)uVar7;
    if (p->nObjs <= (int)Id_00) {
      Vec_IntFree(p_00);
      piVar6 = Gia_ManDeriveNexts(pFinal);
      pFinal->pNexts = piVar6;
      return;
    }
    iVar2 = Gia_ObjIsHead(p,Id_00);
    if (iVar2 != 0) {
      p_00->nSize = 0;
      for (v = Id_00; 0 < (int)v; v = p->pNexts[v]) {
        uVar7 = (ulong)v;
        pGVar5 = Gia_ManObj(p,v);
        if (pGVar5->Value != 0xffffffff) {
          iVar2 = Abc_Lit2Var(pGVar5->Value);
          pGVar5 = Gia_ManObj(pNew,iVar2);
          Entry = Abc_Lit2Var(pGVar5->Value);
          uVar7 = (ulong)Entry;
          Vec_IntPushUnique(p_00,Entry);
        }
      }
      iVar2 = p_00->nSize;
      if (1 < iVar2) {
        Vec_IntSort(p_00,(int)uVar7);
        Num = Vec_IntEntry(p_00,0);
        i = 1;
        iVar8 = Num;
        while (iVar2 != i) {
          Id = Vec_IntEntry(p_00,i);
          Gia_ObjSetRepr(pFinal,Id,Num);
          i = i + 1;
          bVar1 = Id <= iVar8;
          iVar8 = Id;
          if (bVar1) {
            __assert_fail("iPrev < iNode",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x392,
                          "void Gia_ManEquivDeriveReprs(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *)");
          }
        }
      }
    }
    uVar7 = (ulong)(Id_00 + 1);
  } while( true );
}

Assistant:

void Gia_ManEquivDeriveReprs( Gia_Man_t * p, Gia_Man_t * pNew, Gia_Man_t * pFinal )
{
    Vec_Int_t * vClass;
    Gia_Obj_t * pObj, * pObjNew;
    int i, k, iNode, iRepr, iPrev;
    // start representatives
    pFinal->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pFinal) );
    for ( i = 0; i < Gia_ManObjNum(pFinal); i++ )
        Gia_ObjSetRepr( pFinal, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
    {
        pObj = Gia_ManObj( p, i );
        if ( !~pObj->Value )
            continue;
        pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Abc_Lit2Var(pObjNew->Value) == 0 )
            continue;
        Gia_ObjSetRepr( pFinal, Abc_Lit2Var(pObjNew->Value), 0 );
    }
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
        {
            pObj = Gia_ManObj( p, k );
            if ( !~pObj->Value )
                continue;
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
            Vec_IntPushUnique( vClass, Abc_Lit2Var(pObjNew->Value) );
        }
        if ( Vec_IntSize( vClass ) < 2 )
            continue;
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pFinal, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pFinal->pNexts = Gia_ManDeriveNexts( pFinal );
}